

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O3

void __thiscall
iqnet::ssl::Reaction_connection::switch_state(Reaction_connection *this,bool *terminate)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_EDX;
  long lVar3;
  
  switch(this->state) {
  case ACCEPTING:
    lVar3 = 0x80;
    (*(this->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler[0xe])(this);
    goto LAB_00167f3d;
  case CONNECTING:
    lVar3 = 0x88;
    (*(this->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler[0xf])(this);
LAB_00167f3d:
    (**(code **)((long)(this->super_Connection).super_Connection.super_Event_handler.
                       _vptr_Event_handler + lVar3))(this);
    break;
  case READING:
    sVar1 = this->buf_len;
    iVar2 = (*(this->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler[0xd]
            )(this,this->recv_buf,sVar1);
    this->state = EMPTY;
    (*(this->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler[0x12])
              (this,terminate,sVar1,CONCAT44(extraout_var,iVar2));
    break;
  case WRITING:
    (*(this->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler[0xc])
              (this,this->send_buf,this->buf_len);
    this->state = EMPTY;
    (*(this->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler[0x13])
              (this,terminate);
    break;
  case SHUTDOWN:
    Connection::shutdown(&this->super_Connection,(int)terminate,in_EDX);
  default:
    *terminate = true;
  }
  return;
}

Assistant:

void ssl::Reaction_connection::switch_state( bool& terminate )
{
  try
  {
    switch( state )
    {
      case ACCEPTING:
        ssl_accept();
        accept_succeed();
        break;

      case CONNECTING:
        ssl_connect();
        connect_succeed();
        break;

      case READING:
        recv_succeed( terminate, buf_len, try_recv() );
        break;

      case WRITING:
        try_send();
        send_succeed( terminate );
        break;

      case SHUTDOWN:
        ssl::Connection::shutdown();
        terminate = true;
        break;

      case EMPTY:
      default:
        terminate = true;
    }
  }
  catch( const ssl::need_read& )
  {
//    std::cout << "need_read" << std::endl;
    reactor->register_handler( this, Reactor_base::INPUT );
  }
  catch( const ssl::need_write& )
  {
//    std::cout << "need_write" << std::endl;
    reactor->register_handler( this, Reactor_base::OUTPUT );
  }
  catch( const ssl::connection_close& )
  {
//    std::cout << "connection_close " << e.is_clean() << std::endl;
    reg_shutdown();
  }
}